

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_getmypid(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  jx9_vfs *pVfs;
  jx9_int64 nProcessId;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pvVar2 = jx9_context_user_data(pCtx);
  if ((pvVar2 == (void *)0x0) || (*(long *)((long)pvVar2 + 0x130) == 0)) {
    pcVar3 = jx9_function_name(pCtx);
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",pcVar3);
    jx9_result_int(pCtx,-1);
  }
  else {
    uVar1 = (**(code **)((long)pvVar2 + 0x130))();
    jx9_result_int64(pCtx,(ulong)uVar1);
  }
  return 0;
}

Assistant:

static int jx9Vfs_getmypid(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nProcessId;
	jx9_vfs *pVfs;
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xProcessId == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* IO routine not implemented, return -1 */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nProcessId = (jx9_int64)pVfs->xProcessId();
	/* Set the result */
	jx9_result_int64(pCtx, nProcessId);
	return JX9_OK;
}